

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# vktApiCommandBuffersTests.cpp
# Opt level: O0

TestStatus *
vkt::api::anon_unknown_0::renderPassContinueTest
          (TestStatus *__return_storage_ptr__,Context *context)

{
  VkResult VVar1;
  VkCommandBuffer pVVar2;
  TextureLevel *this;
  allocator<char> local_221;
  string local_220;
  undefined4 local_200;
  allocator<char> local_1f9;
  string local_1f8;
  int local_1d4;
  void *pvStack_1d0;
  int colorComponent;
  deUint8 *colorData;
  undefined1 local_1c0 [4];
  deUint32 i;
  PixelBufferAccess pixelBufferAccess;
  MovePtr<tcu::TextureLevel,_de::DefaultDeleter<tcu::TextureLevel>_> result;
  VkClearRect clearRect;
  VkClearAttachment clearAttachment;
  deUint32 clearColor [4];
  VkCommandBuffer secondaryCommandBuffer;
  VkCommandBuffer primaryCommandBuffer;
  CommandBufferRenderPassTestEnvironment env;
  DeviceInterface *vkd;
  Context *context_local;
  
  env.m_secondaryCommandBuffer.super_RefBase<vk::VkCommandBuffer_s_*>.m_data.deleter.m_pool.
  m_internal = (deUint64)Context::getDeviceInterface(context);
  CommandBufferRenderPassTestEnvironment::CommandBufferRenderPassTestEnvironment
            ((CommandBufferRenderPassTestEnvironment *)&primaryCommandBuffer,context,2);
  pVVar2 = CommandBufferRenderPassTestEnvironment::getPrimaryCommandBuffer
                     ((CommandBufferRenderPassTestEnvironment *)&primaryCommandBuffer);
  clearColor._8_8_ =
       CommandBufferRenderPassTestEnvironment::getSecondaryCommandBuffer
                 ((CommandBufferRenderPassTestEnvironment *)&primaryCommandBuffer);
  clearColor[0] = 0x83;
  clearColor[1] = 0xd3;
  clearRect.baseArrayLayer = 1;
  clearRect.layerCount = 0;
  ::vk::makeClearValueColorU32(2,0x2f,0x83,0xd3);
  clearRect.rect.extent.width = 0;
  clearRect.rect.extent.height = 1;
  result.super_UniqueBase<tcu::TextureLevel,_de::DefaultDeleter<tcu::TextureLevel>_>.m_data._8_8_ =
       0;
  clearRect.rect.offset.x = 0xff;
  clearRect.rect.offset.y = 0xff;
  CommandBufferRenderPassTestEnvironment::beginSecondaryCommandBuffer
            ((CommandBufferRenderPassTestEnvironment *)&primaryCommandBuffer,2);
  (**(code **)(*(long *)env.m_secondaryCommandBuffer.super_RefBase<vk::VkCommandBuffer_s_*>.m_data.
                        deleter.m_pool.m_internal + 0x340))
            (env.m_secondaryCommandBuffer.super_RefBase<vk::VkCommandBuffer_s_*>.m_data.deleter.
             m_pool.m_internal,clearColor._8_8_,1,&clearRect.baseArrayLayer,1,
             &result.super_UniqueBase<tcu::TextureLevel,_de::DefaultDeleter<tcu::TextureLevel>_>.
              m_data.field_0x8);
  VVar1 = (**(code **)(*(long *)env.m_secondaryCommandBuffer.super_RefBase<vk::VkCommandBuffer_s_*>.
                                m_data.deleter.m_pool.m_internal + 0x250))
                    (env.m_secondaryCommandBuffer.super_RefBase<vk::VkCommandBuffer_s_*>.m_data.
                     deleter.m_pool.m_internal,clearColor._8_8_);
  ::vk::checkResult(VVar1,"vkd.endCommandBuffer(secondaryCommandBuffer)",
                    "/workspace/llm4binary/github/license_all_cmakelists_25/kaydenl[P]VK-GL-CTS/external/vulkancts/modules/vulkan/api/vktApiCommandBuffersTests.cpp"
                    ,0x872);
  CommandBufferRenderPassTestEnvironment::beginPrimaryCommandBuffer
            ((CommandBufferRenderPassTestEnvironment *)&primaryCommandBuffer,0);
  CommandBufferRenderPassTestEnvironment::beginRenderPass
            ((CommandBufferRenderPassTestEnvironment *)&primaryCommandBuffer,
             VK_SUBPASS_CONTENTS_SECONDARY_COMMAND_BUFFERS);
  (**(code **)(*(long *)env.m_secondaryCommandBuffer.super_RefBase<vk::VkCommandBuffer_s_*>.m_data.
                        deleter.m_pool.m_internal + 0x3b8))
            (env.m_secondaryCommandBuffer.super_RefBase<vk::VkCommandBuffer_s_*>.m_data.deleter.
             m_pool.m_internal,pVVar2,1,clearColor + 2);
  (**(code **)(*(long *)env.m_secondaryCommandBuffer.super_RefBase<vk::VkCommandBuffer_s_*>.m_data.
                        deleter.m_pool.m_internal + 0x3b0))
            (env.m_secondaryCommandBuffer.super_RefBase<vk::VkCommandBuffer_s_*>.m_data.deleter.
             m_pool.m_internal,pVVar2);
  VVar1 = (**(code **)(*(long *)env.m_secondaryCommandBuffer.super_RefBase<vk::VkCommandBuffer_s_*>.
                                m_data.deleter.m_pool.m_internal + 0x250))
                    (env.m_secondaryCommandBuffer.super_RefBase<vk::VkCommandBuffer_s_*>.m_data.
                     deleter.m_pool.m_internal,pVVar2);
  ::vk::checkResult(VVar1,"vkd.endCommandBuffer(primaryCommandBuffer)",
                    "/workspace/llm4binary/github/license_all_cmakelists_25/kaydenl[P]VK-GL-CTS/external/vulkancts/modules/vulkan/api/vktApiCommandBuffersTests.cpp"
                    ,0x87a);
  CommandBufferRenderPassTestEnvironment::submitPrimaryCommandBuffer
            ((CommandBufferRenderPassTestEnvironment *)&primaryCommandBuffer);
  CommandBufferRenderPassTestEnvironment::readColorAttachment
            ((MovePtr<tcu::TextureLevel,_de::DefaultDeleter<tcu::TextureLevel>_> *)
             &pixelBufferAccess.super_ConstPixelBufferAccess.m_data,
             (CommandBufferRenderPassTestEnvironment *)&primaryCommandBuffer);
  this = de::details::UniqueBase<tcu::TextureLevel,_de::DefaultDeleter<tcu::TextureLevel>_>::
         operator->((UniqueBase<tcu::TextureLevel,_de::DefaultDeleter<tcu::TextureLevel>_> *)
                    &pixelBufferAccess.super_ConstPixelBufferAccess.m_data);
  tcu::TextureLevel::getAccess((PixelBufferAccess *)local_1c0,this);
  colorData._4_4_ = 0;
  do {
    if (0xfe00 < colorData._4_4_) {
      std::allocator<char>::allocator();
      std::__cxx11::string::string<std::allocator<char>>
                ((string *)&local_220,"render pass continue test passed",&local_221);
      tcu::TestStatus::pass(__return_storage_ptr__,&local_220);
      std::__cxx11::string::~string((string *)&local_220);
      std::allocator<char>::~allocator(&local_221);
LAB_0084e1c1:
      local_200 = 1;
      de::details::MovePtr<tcu::TextureLevel,_de::DefaultDeleter<tcu::TextureLevel>_>::~MovePtr
                ((MovePtr<tcu::TextureLevel,_de::DefaultDeleter<tcu::TextureLevel>_> *)
                 &pixelBufferAccess.super_ConstPixelBufferAccess.m_data);
      CommandBufferRenderPassTestEnvironment::~CommandBufferRenderPassTestEnvironment
                ((CommandBufferRenderPassTestEnvironment *)&primaryCommandBuffer);
      return __return_storage_ptr__;
    }
    pvStack_1d0 = tcu::PixelBufferAccess::getDataPtr((PixelBufferAccess *)local_1c0);
    for (local_1d4 = 0; local_1d4 < 4; local_1d4 = local_1d4 + 1) {
      if ((uint)*(byte *)((long)pvStack_1d0 + (ulong)(colorData._4_4_ * 4 + local_1d4)) !=
          clearColor[(long)local_1d4 + -2]) {
        std::allocator<char>::allocator();
        std::__cxx11::string::string<std::allocator<char>>
                  ((string *)&local_1f8,"clear value mismatch",&local_1f9);
        tcu::TestStatus::fail(__return_storage_ptr__,&local_1f8);
        std::__cxx11::string::~string((string *)&local_1f8);
        std::allocator<char>::~allocator(&local_1f9);
        goto LAB_0084e1c1;
      }
    }
    colorData._4_4_ = colorData._4_4_ + 1;
  } while( true );
}

Assistant:

tcu::TestStatus renderPassContinueTest(Context& context)
{
	const DeviceInterface&					vkd						= context.getDeviceInterface();
	CommandBufferRenderPassTestEnvironment	env						(context, VK_COMMAND_POOL_CREATE_RESET_COMMAND_BUFFER_BIT);

	VkCommandBuffer							primaryCommandBuffer	= env.getPrimaryCommandBuffer();
	VkCommandBuffer							secondaryCommandBuffer	= env.getSecondaryCommandBuffer();
	const deUint32							clearColor[4]			= { 2, 47, 131, 211 };

	const VkClearAttachment					clearAttachment			=
	{
		VK_IMAGE_ASPECT_COLOR_BIT,									// VkImageAspectFlags	aspectMask;
		0,															// deUint32				colorAttachment;
		makeClearValueColorU32(clearColor[0],
							   clearColor[1],
							   clearColor[2],
							   clearColor[3])						// VkClearValue			clearValue;
	};

	const VkClearRect						clearRect				=
	{
		CommandBufferRenderPassTestEnvironment::DEFAULT_IMAGE_AREA,	// VkRect2D	rect;
		0u,															// deUint32	baseArrayLayer;
		1u															// deUint32	layerCount;
	};

	env.beginSecondaryCommandBuffer(VK_COMMAND_BUFFER_USAGE_RENDER_PASS_CONTINUE_BIT);
	vkd.cmdClearAttachments(secondaryCommandBuffer, 1, &clearAttachment, 1, &clearRect);
	VK_CHECK(vkd.endCommandBuffer(secondaryCommandBuffer));


	env.beginPrimaryCommandBuffer(0);
	env.beginRenderPass(VK_SUBPASS_CONTENTS_SECONDARY_COMMAND_BUFFERS);
	vkd.cmdExecuteCommands(primaryCommandBuffer, 1, &secondaryCommandBuffer);
	vkd.cmdEndRenderPass(primaryCommandBuffer);

	VK_CHECK(vkd.endCommandBuffer(primaryCommandBuffer));

	env.submitPrimaryCommandBuffer();

	de::MovePtr<tcu::TextureLevel>			result					= env.readColorAttachment();
	tcu::PixelBufferAccess					pixelBufferAccess		= result->getAccess();

	for (deUint32 i = 0; i < (CommandBufferRenderPassTestEnvironment::DEFAULT_IMAGE_SIZE.width * CommandBufferRenderPassTestEnvironment::DEFAULT_IMAGE_SIZE.height); ++i)
	{
		deUint8* colorData = reinterpret_cast<deUint8*>(pixelBufferAccess.getDataPtr());
		for (int colorComponent = 0; colorComponent < 4; ++colorComponent)
			if (colorData[i * 4 + colorComponent] != clearColor[colorComponent])
				return tcu::TestStatus::fail("clear value mismatch");
	}

	return tcu::TestStatus::pass("render pass continue test passed");
}